

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffers.c
# Opt level: O1

int ffpbytoff(fitsfile *fptr,long gsize,long ngroups,long offset,void *buffer,int *status)

{
  LONGLONG *pLVar1;
  FITSfile *pFVar2;
  int iVar3;
  long lVar4;
  char *pcVar5;
  void *__src;
  size_t sVar6;
  long lVar7;
  size_t sVar8;
  ulong uVar9;
  long local_70;
  long local_60;
  
  iVar3 = *status;
  if (iVar3 < 1) {
    if (fptr->HDUposition != fptr->Fptr->curhdu) {
      ffmahd(fptr,fptr->HDUposition + 1,(int *)0x0,status);
    }
    if (fptr->Fptr->curbuf < 0) {
      ffldrc(fptr,fptr->Fptr->bytepos / 0xb40,0,status);
    }
    pFVar2 = fptr->Fptr;
    local_70 = (long)pFVar2->curbuf;
    local_60 = pFVar2->bufrecnum[local_70];
    lVar4 = local_60 * -0xb40 + pFVar2->bytepos;
    sVar8 = 0xb40 - lVar4;
    pcVar5 = pFVar2->iobuffer + lVar4 + local_70 * 0xb40;
    iVar3 = pFVar2->curbuf;
    if (1 < ngroups) {
      lVar4 = ngroups + -1;
      __src = buffer;
      do {
        sVar6 = gsize;
        if ((long)sVar8 < gsize) {
          sVar6 = sVar8;
        }
        memcpy(pcVar5,__src,sVar6);
        buffer = (void *)(sVar6 + (long)__src);
        if ((long)sVar8 < gsize) {
          fptr->Fptr->dirty[(int)local_70] = 1;
          local_60 = local_60 + 1;
          ffldrc(fptr,local_60,1,status);
          local_70 = (long)fptr->Fptr->curbuf;
          pcVar5 = fptr->Fptr->iobuffer + local_70 * 0xb40;
          memcpy(pcVar5,buffer,gsize - sVar6);
          buffer = (void *)((long)__src + gsize);
          lVar7 = (gsize - sVar6) + offset;
          pcVar5 = pcVar5 + lVar7;
          sVar8 = 0xb40 - lVar7;
        }
        else {
          pcVar5 = pcVar5 + sVar6 + offset;
          sVar8 = sVar8 - (sVar6 + offset);
        }
        if ((long)sVar8 < 1) {
          fptr->Fptr->dirty[(int)local_70] = 1;
          local_60 = local_60 + (0xb40 - sVar8) / 0xb40;
          ffldrc(fptr,local_60,1,status);
          uVar9 = -sVar8;
          local_70 = (long)fptr->Fptr->curbuf;
          sVar8 = 0xb40 - uVar9 % 0xb40;
          pcVar5 = fptr->Fptr->iobuffer + uVar9 % 0xb40 + local_70 * 0xb40;
        }
        lVar4 = lVar4 + -1;
        __src = buffer;
        iVar3 = (int)local_70;
      } while (lVar4 != 0);
    }
    local_70._0_4_ = iVar3;
    sVar6 = gsize;
    if ((long)sVar8 < gsize) {
      sVar6 = sVar8;
    }
    memcpy(pcVar5,buffer,sVar6);
    if ((long)sVar8 < gsize) {
      fptr->Fptr->dirty[(int)local_70] = 1;
      ffldrc(fptr,local_60 + 1,1,status);
      local_70._0_4_ = fptr->Fptr->curbuf;
      memcpy(fptr->Fptr->iobuffer + (long)(int)local_70 * 0xb40,(void *)((long)buffer + sVar6),
             gsize - sVar6);
    }
    pFVar2 = fptr->Fptr;
    pFVar2->dirty[(int)local_70] = 1;
    pLVar1 = &pFVar2->bytepos;
    *pLVar1 = *pLVar1 + (ngroups + -1) * offset + gsize * ngroups;
    iVar3 = *status;
  }
  return iVar3;
}

Assistant:

int ffpbytoff(fitsfile *fptr, /* I - FITS file pointer                   */
           long gsize,        /* I - size of each group of bytes         */
           long ngroups,      /* I - number of groups to write           */
           long offset,       /* I - size of gap between groups          */
           void *buffer,      /* I - buffer to be written                */
           int *status)       /* IO - error status                       */
/*
  put (write) the buffer of bytes to the output FITS file, with an offset
  between each group of bytes.  This function combines ffmbyt and ffpbyt
  for increased efficiency.
*/
{
    int bcurrent;
    long ii, bufpos, nspace, nwrite, record;
    char *cptr, *ioptr;

    if (*status > 0)
       return(*status);

    if (fptr->HDUposition != (fptr->Fptr)->curhdu)
        ffmahd(fptr, (fptr->HDUposition) + 1, NULL, status);

    if ((fptr->Fptr)->curbuf < 0)  /* no current data buffer for this file */
    {                              /* so reload the last one that was used */
      ffldrc(fptr, (long) (((fptr->Fptr)->bytepos) / IOBUFLEN), REPORT_EOF, status);
    }

    cptr = (char *)buffer;
    bcurrent = (fptr->Fptr)->curbuf;     /* number of the current IO buffer */
    record = (fptr->Fptr)->bufrecnum[bcurrent];  /* zero-indexed record number */
    bufpos = (long) ((fptr->Fptr)->bytepos - ((LONGLONG)record * IOBUFLEN)); /* start pos */
    nspace = IOBUFLEN - bufpos;  /* amount of space left in buffer */
    ioptr = (fptr->Fptr)->iobuffer + (bcurrent * IOBUFLEN) + bufpos;  

    for (ii = 1; ii < ngroups; ii++)  /* write all but the last group */
    {
      /* copy bytes from user's buffer to the IO buffer */
      nwrite = minvalue(gsize, nspace);
      memcpy(ioptr, cptr, nwrite);
      cptr += nwrite;          /* increment buffer pointer */

      if (nwrite < gsize)        /* entire group did not fit */
      {
        (fptr->Fptr)->dirty[bcurrent] = TRUE;  /* mark record as having been modified */
        record++;
        ffldrc(fptr, record, IGNORE_EOF, status);  /* load next record */
        bcurrent = (fptr->Fptr)->curbuf;
        ioptr   = (fptr->Fptr)->iobuffer + (bcurrent * IOBUFLEN);

        nwrite  = gsize - nwrite;
        memcpy(ioptr, cptr, nwrite);
        cptr   += nwrite;            /* increment buffer pointer */
        ioptr  += (offset + nwrite); /* increment IO buffer pointer */
        nspace = IOBUFLEN - offset - nwrite;  /* amount of space left */
      }
      else
      {
        ioptr  += (offset + nwrite);  /* increment IO bufer pointer */
        nspace -= (offset + nwrite);
      }

      if (nspace <= 0) /* beyond current record? */
      {
        (fptr->Fptr)->dirty[bcurrent] = TRUE;
        record += ((IOBUFLEN - nspace) / IOBUFLEN); /* new record number */
        ffldrc(fptr, record, IGNORE_EOF, status);
        bcurrent = (fptr->Fptr)->curbuf;

        bufpos = (-nspace) % IOBUFLEN; /* starting buffer pos */
        nspace = IOBUFLEN - bufpos;
        ioptr = (fptr->Fptr)->iobuffer + (bcurrent * IOBUFLEN) + bufpos;  
      }
    }
      
    /* now write the last group */
    nwrite = minvalue(gsize, nspace);
    memcpy(ioptr, cptr, nwrite);
    cptr += nwrite;          /* increment buffer pointer */

    if (nwrite < gsize)        /* entire group did not fit */
    {
      (fptr->Fptr)->dirty[bcurrent] = TRUE;  /* mark record as having been modified */
      record++;
      ffldrc(fptr, record, IGNORE_EOF, status);  /* load next record */
      bcurrent = (fptr->Fptr)->curbuf;
      ioptr   = (fptr->Fptr)->iobuffer + (bcurrent * IOBUFLEN);

      nwrite  = gsize - nwrite;
      memcpy(ioptr, cptr, nwrite);
    }

    (fptr->Fptr)->dirty[bcurrent] = TRUE;    /* mark record as having been modified */
    (fptr->Fptr)->bytepos = (fptr->Fptr)->bytepos + (ngroups * gsize)
                                  + (ngroups - 1) * offset;
    return(*status);
}